

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelDefinesByProperties::IfcRelDefinesByProperties
          (IfcRelDefinesByProperties *this,void **vtt)

{
  void *pvVar1;
  
  IfcRelDefines::IfcRelDefines(&this->super_IfcRelDefines,vtt + 1);
  pvVar1 = vtt[0x10];
  *(void **)&(this->super_IfcRelDefines).field_0xc0 = pvVar1;
  *(void **)(&(this->super_IfcRelDefines).field_0xc0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x11];
  *(undefined8 *)&(this->super_IfcRelDefines).field_0xc8 = 0;
  pvVar1 = *vtt;
  *(void **)&this->super_IfcRelDefines = pvVar1;
  *(void **)(&(this->super_IfcRelDefines).field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x12];
  *(void **)&(this->super_IfcRelDefines).field_0x88 = vtt[0x13];
  (this->super_IfcRelDefines).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x14];
  *(void **)&(this->super_IfcRelDefines).field_0xc0 = vtt[0x15];
  *(undefined8 *)&(this->super_IfcRelDefines).field_0xd0 = 0;
  return;
}

Assistant:

IfcRelDefinesByProperties() : Object("IfcRelDefinesByProperties") {}